

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::LowBDConvolveHorizRSTest_DISABLED_Speed_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::LowBDConvolveHorizRSTest_DISABLED_Speed_Test>
           *this)

{
  LowBDConvolveHorizRSTest *this_00;
  
  WithParamInterface<std::tuple<void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int,short_const*,int,int)>>
  ::parameter_ = &this->parameter_;
  this_00 = (LowBDConvolveHorizRSTest *)operator_new(0x30);
  anon_unknown.dwarf_1f38a46::LowBDConvolveHorizRSTest::LowBDConvolveHorizRSTest(this_00);
  (this_00->super_ConvolveHorizRSTestBase<unsigned_char>).super_Test._vptr_Test =
       (_func_int **)&PTR__LowBDConvolveHorizRSTest_00f70af8;
  (this_00->
  super_WithParamInterface<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_short_*,_int,_int)>_>
  )._vptr_WithParamInterface = (_func_int **)&DAT_00f70b40;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }